

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  char *pcVar4;
  ulong uVar5;
  char (*in_R8) [2];
  string *in_R9;
  char (*ts_3) [3];
  char **in_stack_fffffffffffff658;
  Op local_924;
  int local_914;
  string local_910;
  spirv_cross local_8f0 [8];
  string bitcast_op_3;
  string local_8c8;
  undefined1 local_8a8 [8];
  string store_expr_3;
  uint32_t c_1;
  uint32_t r_1;
  string local_860;
  undefined1 local_840 [8];
  SPIRType scalar_type_1;
  string local_6d8;
  spirv_cross local_6b8 [8];
  string bitcast_op_2;
  undefined1 local_678 [8];
  string store_expr_2;
  string local_650 [4];
  uint32_t c;
  string local_630;
  undefined1 local_610 [8];
  SPIRType vector_type;
  char *store_op_1;
  string local_4a0;
  spirv_cross local_480 [8];
  string bitcast_op_1;
  string store_expr_1;
  string local_438 [4];
  uint32_t r;
  string local_418;
  undefined1 local_3f8 [8];
  SPIRType scalar_type;
  spirv_cross local_278 [8];
  string bitcast_op;
  string store_expr;
  char *store_op;
  string local_210;
  undefined1 local_1f0 [8];
  string template_expr;
  undefined1 local_1c8 [8];
  string base;
  bool templated_store;
  undefined1 local_190 [8];
  SPIRType target_type;
  SPIRType *type;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  uint32_t value_local;
  SPIRAccessChain *chain_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  target_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,uVar2);
  bVar1 = Compiler::is_scalar((Compiler *)this,
                              (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
  if (bVar1) {
    local_924 = OpTypeInt;
  }
  else {
    local_924 = *(Op *)((long)&target_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4);
  }
  SPIRType::SPIRType((SPIRType *)local_190,local_924);
  target_type.super_IVariant.self.id = 8;
  target_type.basetype = *(BaseType *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt
  ;
  target_type.width =
       *(uint32_t *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
  bVar1 = VectorView<unsigned_int>::empty
                    ((VectorView<unsigned_int> *)
                     (target_type.member_name_cache._M_h._M_single_bucket + 4));
  if (bVar1) {
    if (*(int *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt == 0xf) {
      write_access_chain_struct(this,chain,value,composite_chain);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
      Compiler::register_write((Compiler *)this,uVar2);
    }
    else {
      if ((*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4) !=
           0x20) && (((this->hlsl_options).enable_16bit_types & 1U) == 0)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,
                   "Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                  );
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      base.field_2._M_local_buf[0xf] = 0x3d < (this->hlsl_options).shader_model;
      ::std::__cxx11::string::string((string *)local_1c8,(string *)&chain->base);
      template_expr.field_2._12_4_ = (chain->super_IVariant).self.id;
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)template_expr.field_2._12_4_,DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_1c8,uVar2);
      }
      ::std::__cxx11::string::string((string *)local_1f0);
      if ((base.field_2._M_local_buf[0xf] & 1U) != 0) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&store_op,this,target_type.member_name_cache._M_h._M_single_bucket,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_210,(spirv_cross *)0x569209,(char (*) [2])&store_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_210);
        ::std::__cxx11::string::~string((string *)&local_210);
        ::std::__cxx11::string::~string((string *)&store_op);
      }
      if ((*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4) == 1)
         && ((chain->row_major_matrix & 1U) == 0)) {
        store_expr.field_2._8_8_ = 0;
        switch(*(undefined4 *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
        case 1:
          store_expr.field_2._8_8_ = (long)".Store" + 1;
          break;
        case 2:
          store_expr.field_2._8_8_ = anon_var_dwarf_47ce55;
          break;
        case 3:
          store_expr.field_2._8_8_ = anon_var_dwarf_47ce61;
          break;
        case 4:
          store_expr.field_2._8_8_ = anon_var_dwarf_47ce6d;
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Unknown vector size.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        write_access_chain_value_abi_cxx11_
                  ((string *)((long)&bitcast_op.field_2 + 8),this,value,composite_chain,false);
        if ((base.field_2._M_local_buf[0xf] & 1U) == 0) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                    (local_278,this,local_190,target_type.member_name_cache._M_h._M_single_bucket);
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket,local_278,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375
                       ,(char (*) [2])((long)&bitcast_op.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b
                       ,(char (*) [2])in_R9);
            ::std::__cxx11::string::operator=
                      ((string *)(bitcast_op.field_2._M_local_buf + 8),
                       (string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
            ::std::__cxx11::string::~string
                      ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
          }
          ::std::__cxx11::string::~string((string *)local_278);
        }
        else {
          store_expr.field_2._8_8_ = (long)".Store" + 1;
        }
        CompilerGLSL::
        statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   (char (*) [2])0x565143,(char **)((long)&store_expr.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   (char (*) [2])0x5ac375,&chain->dynamic_index,&chain->static_index,
                   (char (*) [3])0x5a8753,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bitcast_op.field_2 + 8),(char (*) [3])0x5b6d88);
        ::std::__cxx11::string::~string((string *)(bitcast_op.field_2._M_local_buf + 8));
      }
      else if (*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4) ==
               1) {
        if ((base.field_2._M_local_buf[0xf] & 1U) != 0) {
          SPIRType::SPIRType((SPIRType *)local_3f8,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type.basetype = Void;
          scalar_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_438,this,local_3f8,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_418,(spirv_cross *)0x569209,(char (*) [2])local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_418);
          ::std::__cxx11::string::~string((string *)&local_418);
          ::std::__cxx11::string::~string(local_438);
          SPIRType::~SPIRType((SPIRType *)local_3f8);
        }
        for (store_expr_1.field_2._12_4_ = 0;
            (uint)store_expr_1.field_2._12_4_ <
            *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            store_expr_1.field_2._12_4_ = store_expr_1.field_2._12_4_ + 1) {
          write_access_chain_value_abi_cxx11_
                    ((string *)((long)&bitcast_op_1.field_2 + 8),this,value,composite_chain,true);
          if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            ::std::__cxx11::string::operator+=
                      ((string *)(bitcast_op_1.field_2._M_local_buf + 8),".");
            pcVar4 = CompilerGLSL::index_to_swizzle
                               (&this->super_CompilerGLSL,store_expr_1.field_2._12_4_);
            ::std::__cxx11::string::operator+=
                      ((string *)(bitcast_op_1.field_2._M_local_buf + 8),pcVar4);
          }
          CompilerGLSL::remove_duplicate_swizzle
                    (&this->super_CompilerGLSL,(string *)((long)&bitcast_op_1.field_2 + 8));
          if ((base.field_2._M_local_buf[0xf] & 1U) == 0) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (local_480,this,local_190,target_type.member_name_cache._M_h._M_single_bucket)
            ;
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_4a0,local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5ac375,(char (*) [2])((long)&bitcast_op_1.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5b7d4b,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=
                        ((string *)(bitcast_op_1.field_2._M_local_buf + 8),(string *)&local_4a0);
              ::std::__cxx11::string::~string((string *)&local_4a0);
            }
            ::std::__cxx11::string::~string((string *)local_480);
          }
          in_R9 = &chain->dynamic_index;
          store_op_1._4_4_ =
               chain->static_index + chain->matrix_stride * store_expr_1.field_2._12_4_;
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     (char (*) [7])".Store",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     (char (*) [2])0x5ac375,in_R9,(uint *)((long)&store_op_1 + 4),
                     (char (*) [3])0x5a8753,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&bitcast_op_1.field_2 + 8),(char (*) [3])0x5b6d88);
          ::std::__cxx11::string::~string((string *)(bitcast_op_1.field_2._M_local_buf + 8));
        }
      }
      else if ((chain->row_major_matrix & 1U) == 0) {
        vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
        switch(*(undefined4 *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
        case 1:
          vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x59838a;
          break;
        case 2:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_47ce55;
          break;
        case 3:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_47ce61;
          break;
        case 4:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_47ce6d;
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Unknown vector size.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((base.field_2._M_local_buf[0xf] & 1U) != 0) {
          vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x59838a;
          SPIRType::SPIRType((SPIRType *)local_610,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          vector_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_650,this,local_610,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_630,(spirv_cross *)0x569209,(char (*) [2])local_650,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_630);
          ::std::__cxx11::string::~string((string *)&local_630);
          ::std::__cxx11::string::~string(local_650);
          SPIRType::~SPIRType((SPIRType *)local_610);
        }
        for (store_expr_2.field_2._12_4_ = 0;
            (uint)store_expr_2.field_2._12_4_ <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
            store_expr_2.field_2._12_4_ = store_expr_2.field_2._12_4_ + 1) {
          write_access_chain_value_abi_cxx11_
                    ((string *)((long)&bitcast_op_2.field_2 + 8),this,value,composite_chain,true);
          join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((string *)local_678,(spirv_cross *)(bitcast_op_2.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5978ea,
                     (char (*) [2])((long)&store_expr_2.field_2 + 0xc),(uint *)0x5977ef,
                     (char (*) [2])in_R9);
          ::std::__cxx11::string::~string((string *)(bitcast_op_2.field_2._M_local_buf + 8));
          if ((base.field_2._M_local_buf[0xf] & 1U) == 0) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (local_6b8,this,local_190,target_type.member_name_cache._M_h._M_single_bucket)
            ;
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_6d8,local_6b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5ac375,(char (*) [2])local_678,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5b7d4b,(char (*) [2])in_R9);
              ::std::__cxx11::string::operator=((string *)local_678,(string *)&local_6d8);
              ::std::__cxx11::string::~string((string *)&local_6d8);
            }
            ::std::__cxx11::string::~string((string *)local_6b8);
          }
          scalar_type_1.member_name_cache._M_h._M_single_bucket._4_4_ =
               chain->static_index + store_expr_2.field_2._12_4_ * chain->matrix_stride;
          in_R9 = (string *)0x5ac375;
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     (char (*) [2])0x565143,
                     (char **)&vector_type.member_name_cache._M_h._M_single_bucket,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     (char (*) [2])0x5ac375,&chain->dynamic_index,
                     (uint *)((long)&scalar_type_1.member_name_cache._M_h._M_single_bucket + 4),
                     (char (*) [3])0x5a8753,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678,
                     (char (*) [3])0x5b6d88);
          ::std::__cxx11::string::~string((string *)local_678);
        }
      }
      else {
        if ((base.field_2._M_local_buf[0xf] & 1U) != 0) {
          SPIRType::SPIRType((SPIRType *)local_840,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type_1.basetype = Void;
          scalar_type_1.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&c_1,this,local_840,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_860,(spirv_cross *)0x569209,(char (*) [2])&c_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_860);
          ::std::__cxx11::string::~string((string *)&local_860);
          ::std::__cxx11::string::~string((string *)&c_1);
          SPIRType::~SPIRType((SPIRType *)local_840);
        }
        for (store_expr_3.field_2._12_4_ = 0;
            (uint)store_expr_3.field_2._12_4_ <
            *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            store_expr_3.field_2._12_4_ = store_expr_3.field_2._12_4_ + 1) {
          for (store_expr_3.field_2._8_4_ = 0;
              (uint)store_expr_3.field_2._8_4_ <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
              store_expr_3.field_2._8_4_ = store_expr_3.field_2._8_4_ + 1) {
            write_access_chain_value_abi_cxx11_(&local_8c8,this,value,composite_chain,true);
            bitcast_op_3.field_2._8_8_ =
                 CompilerGLSL::index_to_swizzle
                           (&this->super_CompilerGLSL,store_expr_3.field_2._12_4_);
            ts_3 = (char (*) [3])((long)&bitcast_op_3.field_2 + 8);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],char_const*>
                      ((string *)local_8a8,(spirv_cross *)&local_8c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5978ea
                       ,(char (*) [2])((long)&store_expr_3.field_2 + 8),(uint *)0x5b81a1,ts_3,
                       in_stack_fffffffffffff658);
            ::std::__cxx11::string::~string((string *)&local_8c8);
            CompilerGLSL::remove_duplicate_swizzle(&this->super_CompilerGLSL,(string *)local_8a8);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
                      (local_8f0,this,local_190,target_type.member_name_cache._M_h._M_single_bucket)
            ;
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                        (&local_910,local_8f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5ac375,(char (*) [2])local_8a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5b7d4b,(char (*) [2])ts_3);
              ::std::__cxx11::string::operator=((string *)local_8a8,(string *)&local_910);
              ::std::__cxx11::string::~string((string *)&local_910);
            }
            local_914 = chain->static_index +
                        store_expr_3.field_2._8_4_ *
                        (*(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2].
                                          _M_nxt + 4) >> 3) +
                        store_expr_3.field_2._12_4_ * chain->matrix_stride;
            in_stack_fffffffffffff658 = (char **)&local_914;
            CompilerGLSL::
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,(char (*) [7])".Store",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,(char (*) [2])0x5ac375,&chain->dynamic_index,
                       (uint *)in_stack_fffffffffffff658,(char (*) [3])0x5a8753,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8a8,(char (*) [3])0x5b6d88);
            ::std::__cxx11::string::~string((string *)local_8f0);
            ::std::__cxx11::string::~string((string *)local_8a8);
          }
        }
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
      Compiler::register_write((Compiler *)this,uVar2);
      ::std::__cxx11::string::~string((string *)local_1f0);
      ::std::__cxx11::string::~string((string *)local_1c8);
    }
  }
  else {
    write_access_chain_array(this,chain,value,composite_chain);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
    Compiler::register_write((Compiler *)this,uVar2);
  }
  SPIRType::~SPIRType((SPIRType *)local_190);
  return;
}

Assistant:

void CompilerHLSL::write_access_chain(const SPIRAccessChain &chain, uint32_t value,
                                      const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Make sure we trigger a read of the constituents in the access chain.
	track_expression_read(chain.self);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		write_access_chain_array(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		write_access_chain_struct(chain, value, composite_chain);
		register_write(chain.self);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Writing types other than 32-bit to RWByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_store = hlsl_options.shader_model >= 62;

	auto base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	string template_expr;
	if (templated_store)
		template_expr = join("<", type_to_glsl(type), ">");

	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		auto store_expr = write_access_chain_value(value, composite_chain, false);

		if (!templated_store)
		{
			auto bitcast_op = bitcast_glsl_op(target_type, type);
			if (!bitcast_op.empty())
				store_expr = join(bitcast_op, "(", store_expr, ")");
		}
		else
			store_op = "Store";
		statement(base, ".", store_op, template_expr, "(", chain.dynamic_index, chain.static_index, ", ",
		          store_expr, ");");
	}
	else if (type.columns == 1)
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		// Strided store.
		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			auto store_expr = write_access_chain_value(value, composite_chain, true);
			if (type.vecsize > 1)
			{
				store_expr += ".";
				store_expr += index_to_swizzle(r);
			}
			remove_duplicate_swizzle(store_expr);

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".Store", template_expr, "(", chain.dynamic_index,
			          chain.static_index + chain.matrix_stride * r, ", ", store_expr, ");");
		}
	}
	else if (!chain.row_major_matrix)
	{
		const char *store_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			store_op = "Store";
			break;
		case 2:
			store_op = "Store2";
			break;
		case 3:
			store_op = "Store3";
			break;
		case 4:
			store_op = "Store4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_store)
		{
			store_op = "Store";
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
		}

		for (uint32_t c = 0; c < type.columns; c++)
		{
			auto store_expr = join(write_access_chain_value(value, composite_chain, true), "[", c, "]");

			if (!templated_store)
			{
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
			}

			statement(base, ".", store_op, template_expr, "(", chain.dynamic_index,
			          chain.static_index + c * chain.matrix_stride, ", ", store_expr, ");");
		}
	}
	else
	{
		if (templated_store)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			for (uint32_t c = 0; c < type.columns; c++)
			{
				auto store_expr =
				    join(write_access_chain_value(value, composite_chain, true), "[", c, "].", index_to_swizzle(r));
				remove_duplicate_swizzle(store_expr);
				auto bitcast_op = bitcast_glsl_op(target_type, type);
				if (!bitcast_op.empty())
					store_expr = join(bitcast_op, "(", store_expr, ")");
				statement(base, ".Store", template_expr, "(", chain.dynamic_index,
				          chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ", ", store_expr, ");");
			}
		}
	}

	register_write(chain.self);
}